

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::MergeGenericAddSubArithmetic::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *param_3)

{
  Op OVar1;
  uint32_t uVar2;
  uint32_t sub;
  TypeManager *this_00;
  Type *type_00;
  bool bVar3;
  uint32_t add_op1;
  uint32_t add_op0;
  uint32_t width;
  bool uses_float;
  Type *type;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_3_local;
  Instruction *inst_local;
  IRContext *context_local;
  anon_class_1_0_00000001 *this_local;
  
  OVar1 = opt::Instruction::opcode(inst);
  bVar3 = true;
  if (OVar1 != OpFAdd) {
    OVar1 = opt::Instruction::opcode(inst);
    bVar3 = OVar1 == OpIAdd;
  }
  if (bVar3) {
    this_00 = IRContext::get_type_mgr(context);
    uVar2 = opt::Instruction::type_id(inst);
    type_00 = analysis::TypeManager::GetType(this_00,uVar2);
    bVar3 = IsCooperativeMatrix(type_00);
    if (bVar3) {
      this_local._7_1_ = false;
    }
    else {
      bVar3 = HasFloatingPoint(type_00);
      if ((bVar3) && (bVar3 = opt::Instruction::IsFloatingPointFoldingAllowed(inst), !bVar3)) {
        return false;
      }
      uVar2 = ElementWidth(type_00);
      if ((uVar2 == 0x20) || (uVar2 == 0x40)) {
        uVar2 = opt::Instruction::GetSingleWordInOperand(inst,0);
        sub = opt::Instruction::GetSingleWordInOperand(inst,1);
        bVar3 = MergeGenericAddendSub(uVar2,sub,inst);
        if (bVar3) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = MergeGenericAddendSub(sub,uVar2,inst);
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    return this_local._7_1_;
  }
  __assert_fail("inst->opcode() == spv::Op::OpFAdd || inst->opcode() == spv::Op::OpIAdd",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0x5b2,
                "auto spvtools::opt::(anonymous namespace)::MergeGenericAddSubArithmetic()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
               );
}

Assistant:

FoldingRule MergeGenericAddSubArithmetic() {
  return [](IRContext* context, Instruction* inst,
            const std::vector<const analysis::Constant*>&) {
    assert(inst->opcode() == spv::Op::OpFAdd ||
           inst->opcode() == spv::Op::OpIAdd);
    const analysis::Type* type =
        context->get_type_mgr()->GetType(inst->type_id());

    if (IsCooperativeMatrix(type)) {
      return false;
    }

    bool uses_float = HasFloatingPoint(type);
    if (uses_float && !inst->IsFloatingPointFoldingAllowed()) return false;

    uint32_t width = ElementWidth(type);
    if (width != 32 && width != 64) return false;

    uint32_t add_op0 = inst->GetSingleWordInOperand(0);
    uint32_t add_op1 = inst->GetSingleWordInOperand(1);
    if (MergeGenericAddendSub(add_op0, add_op1, inst)) return true;
    return MergeGenericAddendSub(add_op1, add_op0, inst);
  };
}